

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  bool bVar1;
  uint uVar2;
  ON_SubDComponentPtr *pOVar3;
  ON_SubDEdgePtr *pOVar4;
  bool bVar5;
  ON_SubDEdgePtr local_70 [3];
  ON_SubDComponentPtr local_58;
  ON_SubDComponentPtr cptr_1;
  undefined1 local_48 [4];
  uint i_1;
  ON_SimpleArray<ON_SubDEdgePtr> local_unsorted_edges;
  ON_SubDComponentPtr cptr;
  uint i;
  uint unsorted_edges_count;
  bool bCopyInput;
  uint chain_count;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges_local;
  
  pOVar3 = ON_SimpleArray<ON_SubDComponentPtr>::Array(unsorted_edges);
  pOVar4 = ON_SimpleArray<ON_SubDEdgePtr>::Array(sorted_edges);
  bVar5 = pOVar3 == (ON_SubDComponentPtr *)pOVar4;
  uVar2 = ON_SimpleArray<ON_SubDComponentPtr>::Count(unsorted_edges);
  cptr.m_ptr._0_4_ = 0;
  do {
    if (uVar2 <= (uint)cptr.m_ptr) {
LAB_008aba7f:
      if (bVar5) {
        ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray
                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_48,(ulong)uVar2);
        for (cptr_1.m_ptr._4_4_ = 0; cptr_1.m_ptr._4_4_ < uVar2;
            cptr_1.m_ptr._4_4_ = cptr_1.m_ptr._4_4_ + 1) {
          pOVar3 = ON_SimpleArray<ON_SubDComponentPtr>::operator[]
                             (unsorted_edges,cptr_1.m_ptr._4_4_);
          local_58.m_ptr = pOVar3->m_ptr;
          bVar5 = ON_SubDComponentPtr::IsEdge(&local_58);
          if (bVar5) {
            local_70[0] = ON_SubDComponentPtr::EdgePtr(&local_58);
            ON_SimpleArray<ON_SubDEdgePtr>::Append
                      ((ON_SimpleArray<ON_SubDEdgePtr> *)local_48,local_70);
          }
        }
        pOVar4 = ON_SimpleArray<ON_SubDEdgePtr>::Array((ON_SimpleArray<ON_SubDEdgePtr> *)local_48);
        uVar2 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(unsorted_edges);
        unsorted_edges_count =
             Internal_MuchImprovedSortEdgesIntoChains(&pOVar4->m_ptr,(ulong)uVar2,sorted_edges);
        ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_48);
      }
      else {
        pOVar3 = ON_SimpleArray<ON_SubDComponentPtr>::Array(unsorted_edges);
        uVar2 = ON_SimpleArray<ON_SubDComponentPtr>::UnsignedCount(unsorted_edges);
        unsorted_edges_count =
             Internal_MuchImprovedSortEdgesIntoChains(&pOVar3->m_ptr,(ulong)uVar2,sorted_edges);
      }
      return unsorted_edges_count;
    }
    pOVar3 = ON_SimpleArray<ON_SubDComponentPtr>::operator[](unsorted_edges,(uint)cptr.m_ptr);
    local_unsorted_edges._16_8_ = pOVar3->m_ptr;
    bVar1 = ON_SubDComponentPtr::IsEdge((ON_SubDComponentPtr *)&local_unsorted_edges.m_count);
    if ((!bVar1) &&
       (bVar1 = ON_SubDComponentPtr::IsNull((ON_SubDComponentPtr *)&local_unsorted_edges.m_count),
       !bVar1)) {
      bVar5 = true;
      goto LAB_008aba7f;
    }
    cptr.m_ptr._0_4_ = (uint)cptr.m_ptr + 1;
  } while( true );
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& unsorted_edges,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  unsigned int chain_count = 0;
  bool bCopyInput = (const void*)unsorted_edges.Array() == (const void*)sorted_edges.Array();
  const unsigned unsorted_edges_count = unsorted_edges.Count();
  for (unsigned i = 0; i < unsorted_edges_count; ++i)
  {
    ON_SubDComponentPtr cptr = unsorted_edges[i];
    if (cptr.IsEdge() || cptr.IsNull())
      continue;
    bCopyInput = true;
    break;
  }
  if (bCopyInput)
  {
    ON_SimpleArray< ON_SubDEdgePtr > local_unsorted_edges(unsorted_edges_count);
    for (unsigned i = 0; i < unsorted_edges_count; ++i)
    {
      ON_SubDComponentPtr cptr = unsorted_edges[i];
      if (cptr.IsEdge())
        local_unsorted_edges.Append(cptr.EdgePtr());
    }
    chain_count = Internal_MuchImprovedSortEdgesIntoChains(
      (const ON__UINT_PTR*)local_unsorted_edges.Array(),
      unsorted_edges.UnsignedCount(),
      sorted_edges
    );
  }
  else
  {
    chain_count = Internal_MuchImprovedSortEdgesIntoChains(
      (const ON__UINT_PTR*)unsorted_edges.Array(),
      unsorted_edges.UnsignedCount(),
      sorted_edges
    );
  }
  return chain_count;
}